

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_tetgen_volume(REF_GRID ref_grid,char *project,char *options)

{
  REF_NODE ref_node;
  REF_DBL *pRVar1;
  REF_CELL pRVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  REF_STATUS RVar8;
  FILE *pFVar9;
  undefined8 uVar10;
  char *pcVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  REF_LONG ref_private_status_reis_ai;
  REF_INT item;
  REF_INT mark;
  REF_INT new_cell;
  REF_INT nnode;
  REF_INT new_node;
  REF_INT ntet;
  REF_INT ntri;
  REF_DBL xyz [3];
  REF_INT node_per;
  REF_INT attr;
  REF_INT ndim;
  REF_GLOB global;
  REF_INT id;
  REF_INT nodes [27];
  char filename [896];
  char command [1024];
  ulong local_8a8;
  void *local_8a0;
  uint local_894;
  int local_890;
  int local_88c;
  ulong local_888;
  uint local_87c;
  int local_878;
  uint local_874;
  int local_870;
  int local_86c;
  double local_868;
  double local_860;
  double local_858 [2];
  int local_844;
  int local_840;
  int local_83c;
  ulong local_838;
  undefined1 local_82c [4];
  REF_INT local_828;
  REF_INT local_824;
  REF_INT local_820;
  uint local_81c;
  char local_7b8 [896];
  char local_438 [1032];
  
  ref_node = ref_grid->node;
  printf("%d surface nodes %d triangles\n",(ulong)(uint)ref_node->n,
         (ulong)(uint)ref_grid->cell[3]->n);
  snprintf(local_7b8,0x380,"%s-tetgen.poly",project);
  uVar4 = ref_export_by_extension(ref_grid,local_7b8);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x879,
           "ref_geom_tetgen_volume",(ulong)uVar4,"poly");
    return uVar4;
  }
  puts("  The \'S1000\' argument can be added to tetgen options");
  puts("    to cap inserted nodes at 1000 and reduce run time.");
  puts("  The \'q20/10\' arguments (radius-edge-ratio/dihedral-angle)");
  puts("    can be increased for faster initial volume refinement.");
  puts("  The \'O7/7\' arguments (optimization iterations/operation)");
  puts("    can be decreased for faster mesh optimization.");
  puts("  See \'ref bootstrap -h\' for \'--mesher-options\' description");
  puts("    and the TetGen user manual for details.");
  if (options == (char *)0x0) {
    snprintf(local_438,0x400,"tetgen -pMYq20/10O7/7zVT1e-12 %s < /dev/null > %s-tetgen.txt",
             local_7b8,project);
  }
  else {
    snprintf(local_438,0x400,"tetgen %s %s < /dev/null > %s-tetgen.txt",options,local_7b8,project);
  }
  puts(local_438);
  fflush(_stdout);
  uVar4 = sleep(2);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x88e,
           "ref_geom_tetgen_volume","sleep failed",0,(ulong)uVar4);
    return 1;
  }
  iVar5 = system(local_438);
  uVar4 = sleep(2);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x890,
           "ref_geom_tetgen_volume","sleep failed",0,(ulong)uVar4);
    return 1;
  }
  if (iVar5 != 0) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x896,
           "ref_geom_tetgen_volume","tetgen failed",0,(long)iVar5);
    puts("tec360 ref_geom_test_tetgen_geom.tec");
    ref_geom_tec(ref_grid,"ref_geom_test_tetgen_geom.tec");
    puts("tec360 ref_geom_test_tetgen_surf.tec");
    ref_export_tec_surf(ref_grid,"ref_geom_test_tetgen_surf.tec");
    return 1;
  }
  snprintf(local_7b8,0x380,"%s-tetgen.1.node",project);
  pFVar9 = fopen(local_7b8,"r");
  if (pFVar9 == (FILE *)0x0) {
    printf("unable to open %s\n",local_7b8);
    uVar10 = 0x89b;
    goto LAB_0014c1a5;
  }
  iVar5 = __isoc99_fscanf(pFVar9,"%d",&local_878);
  if (iVar5 != 1) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x89d,
           "ref_geom_tetgen_volume","node header nnode",1,(long)iVar5);
    return 1;
  }
  iVar5 = __isoc99_fscanf(pFVar9,"%d",&local_83c);
  if (iVar5 != 1) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x89e,
           "ref_geom_tetgen_volume","node header ndim",1,(long)iVar5);
    return 1;
  }
  lVar12 = (long)local_83c;
  if (lVar12 != 3) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x89f,
           "ref_geom_tetgen_volume","not 3D",3,lVar12);
  }
  uVar4 = (uint)(lVar12 != 3);
  if (local_83c != 3) {
    return uVar4;
  }
  iVar5 = __isoc99_fscanf(pFVar9,"%d",&local_840);
  if (iVar5 != 1) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x8a0,
           "ref_geom_tetgen_volume","node header attr",1,(long)iVar5);
    return 1;
  }
  if ((long)local_840 != 0) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x8a1,
           "ref_geom_tetgen_volume","nodes have attribute 3D",0,(long)local_840);
    uVar4 = 1;
  }
  if (local_840 != 0) {
    return uVar4;
  }
  iVar6 = __isoc99_fscanf(pFVar9,"%d",&local_890);
  iVar5 = local_890;
  if (iVar6 != 1) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x8a2,
           "ref_geom_tetgen_volume","node header mark",1,(long)iVar6);
    return 1;
  }
  if ((long)local_890 != 0) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x8a3,
           "ref_geom_tetgen_volume","nodes have mark",0,(long)local_890);
    uVar4 = 1;
  }
  if (iVar5 != 0) {
    return uVar4;
  }
  iVar5 = ref_node->n;
  local_8a0 = (void *)(long)iVar5;
  printf("%d interior nodes\n",(ulong)(uint)(local_878 - iVar5));
  if (0 < (long)local_8a0) {
    local_888 = 0x10;
    local_8a8 = 0;
    do {
      iVar6 = __isoc99_fscanf(pFVar9,"%d",&local_894);
      if (iVar6 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x8ab,"ref_geom_tetgen_volume","node item",1,(long)iVar6);
        return 1;
      }
      if (local_8a8 != local_894) {
        pcVar11 = "node index";
        uVar10 = 0x8ac;
        goto LAB_0014c698;
      }
      iVar6 = __isoc99_fscanf(pFVar9,"%lf",&local_868);
      if (iVar6 != 1) {
        pcVar11 = "x";
        uVar10 = 0x8ad;
        goto LAB_0014c698;
      }
      iVar6 = __isoc99_fscanf(pFVar9,"%lf",&local_860);
      if (iVar6 != 1) {
        pcVar11 = "y";
        uVar10 = 0x8ae;
        goto LAB_0014c698;
      }
      iVar6 = __isoc99_fscanf(pFVar9,"%lf",local_858);
      if (iVar6 != 1) {
        pcVar11 = "z";
        uVar10 = 0x8af;
        goto LAB_0014c698;
      }
      pRVar1 = ref_node->real;
      dVar15 = local_868 - *(double *)((long)pRVar1 + (local_888 - 0x10));
      dVar13 = local_860 - *(double *)((long)pRVar1 + (local_888 - 8));
      dVar14 = local_858[0] - *(double *)((long)pRVar1 + local_888);
      dVar13 = dVar14 * dVar14 + dVar15 * dVar15 + dVar13 * dVar13;
      if (dVar13 < 0.0) {
        dVar13 = sqrt(dVar13);
      }
      else {
        dVar13 = SQRT(dVar13);
      }
      if (1e-12 < dVar13) {
        printf("node %d off by %e\n",local_8a8);
        pcVar11 = "tetgen moved node";
        uVar10 = 0x8b8;
        goto LAB_0014c698;
      }
      local_8a8 = local_8a8 + 1;
      local_888 = local_888 + 0x78;
    } while (local_8a0 != (void *)local_8a8);
  }
  if (iVar5 < local_878) {
    do {
      iVar5 = __isoc99_fscanf(pFVar9,"%d",&local_894);
      if (iVar5 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x8be,"ref_geom_tetgen_volume","node item",1,(long)iVar5);
        return 1;
      }
      if ((uint)local_8a0 != local_894) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x8bf,"ref_geom_tetgen_volume","file node index",local_8a0,(long)(int)local_894);
        return 1;
      }
      uVar7 = ref_node_next_global(ref_node,(REF_GLOB *)&local_838);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x8c0,"ref_geom_tetgen_volume",(ulong)uVar7,"next global");
        return uVar7;
      }
      if (local_8a0 != (void *)local_838) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x8c1,"ref_geom_tetgen_volume","global node index",local_8a0,local_838);
        return 1;
      }
      uVar7 = ref_node_add(ref_node,local_838,(REF_INT *)&local_874);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x8c2,"ref_geom_tetgen_volume",(ulong)uVar7,"new_node");
        return uVar7;
      }
      if ((uint)local_8a0 != local_874) {
        pcVar11 = "node index";
        uVar10 = 0x8c3;
        goto LAB_0014c698;
      }
      iVar5 = __isoc99_fscanf(pFVar9,"%lf",&local_868);
      if (iVar5 != 1) {
        pcVar11 = "x";
        uVar10 = 0x8c4;
        goto LAB_0014c698;
      }
      iVar5 = __isoc99_fscanf(pFVar9,"%lf",&local_860);
      if (iVar5 != 1) {
        pcVar11 = "y";
        uVar10 = 0x8c5;
        goto LAB_0014c698;
      }
      iVar5 = __isoc99_fscanf(pFVar9,"%lf",local_858);
      if (iVar5 != 1) {
        pcVar11 = "z";
        uVar10 = 0x8c6;
        goto LAB_0014c698;
      }
      pRVar1 = ref_node->real;
      lVar12 = (long)(int)local_874;
      pRVar1[lVar12 * 0xf] = local_868;
      pRVar1[lVar12 * 0xf + 1] = local_860;
      pRVar1[lVar12 * 0xf + 2] = local_858[0];
      local_8a0 = (void *)((long)local_8a0 + 1);
    } while ((long)local_8a0 < (long)local_878);
  }
  fclose(pFVar9);
  snprintf(local_7b8,0x380,"%s-tetgen.1.face",project);
  pFVar9 = fopen(local_7b8,"r");
  if (pFVar9 == (FILE *)0x0) {
    printf("unable to open %s\n",local_7b8);
    uVar10 = 0x8d3;
    goto LAB_0014c1a5;
  }
  iVar5 = __isoc99_fscanf(pFVar9,"%d",&local_86c);
  if (iVar5 != 1) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x8d4,
           "ref_geom_tetgen_volume","face header ntri",1,(long)iVar5);
    return 1;
  }
  iVar6 = __isoc99_fscanf(pFVar9,"%d",&local_890);
  iVar5 = local_890;
  if (iVar6 != 1) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x8d5,
           "ref_geom_tetgen_volume","face header mark",1,(long)iVar6);
    return 1;
  }
  if ((long)local_890 != 1) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x8d6,
           "ref_geom_tetgen_volume","face have mark",1,(long)local_890);
    uVar4 = 1;
  }
  if (iVar5 != 1) {
    return uVar4;
  }
  pRVar2 = ref_grid->cell[3];
  if ((long)pRVar2->max < 0) {
    uVar4 = 1;
    pcVar11 = "malloc position of REF_INT negative";
LAB_0014c372:
    bVar3 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x8d9,
           "ref_geom_tetgen_volume",pcVar11);
    local_8a0 = (void *)0x0;
  }
  else {
    local_8a0 = malloc((long)pRVar2->max << 2);
    if (local_8a0 == (void *)0x0) {
      uVar4 = 2;
      pcVar11 = "malloc position of REF_INT NULL";
      goto LAB_0014c372;
    }
    bVar3 = true;
    if (0 < pRVar2->max) {
      lVar12 = 0;
      do {
        *(undefined4 *)((long)local_8a0 + lVar12 * 4) = 0xffffffff;
        lVar12 = lVar12 + 1;
      } while (lVar12 < pRVar2->max);
    }
  }
  if (!bVar3) {
    return uVar4;
  }
  if (local_86c < 1) {
    local_88c = 0;
  }
  else {
    local_888 = local_888 & 0xffffffff00000000;
    local_88c = 0;
    do {
      iVar5 = __isoc99_fscanf(pFVar9,"%d",&local_894);
      if (iVar5 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x8db,"ref_geom_tetgen_volume","tri item",1,(long)iVar5);
        return 1;
      }
      if ((uint)local_888 != local_894) {
        pcVar11 = "tri index";
        uVar10 = 0x8dc;
        goto LAB_0014c698;
      }
      lVar12 = 0;
      do {
        iVar5 = __isoc99_fscanf(pFVar9,"%d",(long)&local_828 + lVar12);
        if (iVar5 != 1) {
          pcVar11 = "tri";
          uVar10 = 0x8de;
          goto LAB_0014c698;
        }
        lVar12 = lVar12 + 4;
      } while (lVar12 != 0xc);
      if ((local_890 == 1) && (iVar5 = __isoc99_fscanf(pFVar9,"%d",local_82c), iVar5 != 1)) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x8df,"ref_geom_tetgen_volume","tri mark id",1,(long)iVar5);
        return 1;
      }
      RVar8 = ref_cell_with(pRVar2,&local_828,(REF_INT *)&local_87c);
      if (RVar8 == 0) {
        *(uint *)((long)local_8a0 + (long)(int)local_87c * 4) = (uint)local_888;
      }
      else {
        ref_node_location(ref_node,local_828);
        ref_node_location(ref_node,local_824);
        ref_node_location(ref_node,local_820);
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x8e7,"ref_geom_tetgen_volume","tetgen face tri not found in ref_grid");
        local_88c = 1;
      }
      iVar5 = (uint)local_888 + 1;
      local_888 = CONCAT44(local_888._4_4_,iVar5);
    } while (iVar5 < local_86c);
  }
  if (0 < pRVar2->max) {
    lVar12 = 0;
    do {
      RVar8 = ref_cell_nodes(pRVar2,(REF_INT)lVar12,&local_828);
      if ((RVar8 == 0) && (*(int *)((long)local_8a0 + lVar12 * 4) == -1)) {
        ref_node_location(ref_node,local_828);
        ref_node_location(ref_node,local_824);
        ref_node_location(ref_node,local_820);
        printf("face id %d\n",(ulong)local_81c);
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x8f1,"ref_geom_tetgen_volume","ref_grid tri not found in tetgen face");
        local_88c = 1;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < pRVar2->max);
  }
  if (local_8a0 != (void *)0x0) {
    free(local_8a0);
  }
  if (local_88c == 0) {
    fclose(pFVar9);
    snprintf(local_7b8,0x380,"%s-tetgen.1.ele",project);
    pFVar9 = fopen(local_7b8,"r");
    if (pFVar9 == (FILE *)0x0) {
      printf("unable to open %s\n",local_7b8);
      uVar10 = 0x8fc;
LAB_0014c1a5:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar10
             ,"ref_geom_tetgen_volume","unable to open file");
      return 2;
    }
    iVar5 = __isoc99_fscanf(pFVar9,"%d",&local_870);
    if (iVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x8fe,
             "ref_geom_tetgen_volume","ele header ntet",1,(long)iVar5);
      return 1;
    }
    iVar5 = __isoc99_fscanf(pFVar9,"%d",&local_844);
    if (iVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x8ff,
             "ref_geom_tetgen_volume","ele header node_per",1,(long)iVar5);
      return 1;
    }
    if ((long)local_844 != 4) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x900,
             "ref_geom_tetgen_volume","expected tets",4,(long)local_844);
      uVar4 = 1;
    }
    if (local_844 != 4) {
      return uVar4;
    }
    iVar5 = __isoc99_fscanf(pFVar9,"%d",&local_890);
    if (iVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x901,
             "ref_geom_tetgen_volume","ele header mark",1,(long)iVar5);
      return 1;
    }
    if ((long)local_890 != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x902,
             "ref_geom_tetgen_volume","ele have mark",0,(long)local_890);
      uVar4 = 1;
    }
    if (local_890 != 0) {
      return uVar4;
    }
    if (0 < local_870) {
      pRVar2 = ref_grid->cell[8];
      uVar4 = 0;
      do {
        iVar5 = __isoc99_fscanf(pFVar9,"%d",&local_894);
        if (iVar5 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x906,"ref_geom_tetgen_volume","tet item",1,(long)iVar5);
          return 1;
        }
        if (uVar4 != local_894) {
          pcVar11 = "tet index";
          uVar10 = 0x907;
          goto LAB_0014c698;
        }
        lVar12 = 0;
        do {
          iVar5 = __isoc99_fscanf(pFVar9,"%d",(long)&local_828 + lVar12);
          if (iVar5 != 1) {
            pcVar11 = "tet";
            uVar10 = 0x909;
            goto LAB_0014c698;
          }
          lVar12 = lVar12 + 4;
        } while (lVar12 != 0x10);
        uVar7 = ref_cell_add(pRVar2,&local_828,(REF_INT *)&local_87c);
        if (uVar7 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x90a,"ref_geom_tetgen_volume",(ulong)uVar7,"new tet");
          return uVar7;
        }
        if (uVar4 != local_87c) {
          pcVar11 = "tet index";
          uVar10 = 0x90b;
          goto LAB_0014c698;
        }
        uVar4 = uVar4 + 1;
      } while ((int)uVar4 < local_870);
    }
    fclose(pFVar9);
    ref_grid->surf = 0;
    snprintf(local_7b8,0x380,"%s-tetgen.1.edge",project);
    iVar5 = remove(local_7b8);
    if (iVar5 != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x914,
             "ref_geom_tetgen_volume","rm .1.edge tetgen output file",0,(long)iVar5);
      return 1;
    }
    snprintf(local_7b8,0x380,"%s-tetgen.1.face",project);
    iVar5 = remove(local_7b8);
    if (iVar5 != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x916,
             "ref_geom_tetgen_volume","rm .1.face tetgen output file",0,(long)iVar5);
      return 1;
    }
    snprintf(local_7b8,0x380,"%s-tetgen.1.node",project);
    iVar5 = remove(local_7b8);
    if (iVar5 != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x918,
             "ref_geom_tetgen_volume","rm .1.node tetgen output file",0,(long)iVar5);
      return 1;
    }
    snprintf(local_7b8,0x380,"%s-tetgen.1.ele",project);
    iVar5 = remove(local_7b8);
    if (iVar5 != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x91a,
             "ref_geom_tetgen_volume","rm .1.ele tetgen output file",0,(long)iVar5);
      return 1;
    }
    snprintf(local_7b8,0x380,"%s-tetgen.poly",project);
    iVar5 = remove(local_7b8);
    if (iVar5 == 0) {
      return 0;
    }
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x91c,
           "ref_geom_tetgen_volume","rm .poly tetgen input file",0,(long)iVar5);
  }
  else {
    pcVar11 = "problem detected in tetgen triangles";
    uVar10 = 0x8f5;
LAB_0014c698:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar10,
           "ref_geom_tetgen_volume",pcVar11);
  }
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_geom_tetgen_volume(REF_GRID ref_grid,
                                          const char *project,
                                          const char *options) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  char filename[896];
  char command[1024];
  FILE *file;
  REF_INT nnode, ndim, attr, mark;
  REF_GLOB global;
  REF_INT ntri, ntet, node_per, id;
  REF_INT node, nnode_surface, item, new_node;
  REF_DBL xyz[3], dist;
  REF_INT cell, new_cell, nodes[REF_CELL_MAX_SIZE_PER];
  int system_status;
  REF_BOOL delete_temp_files = REF_TRUE;
  REF_BOOL problem;
  REF_BOOL *position;

  printf("%d surface nodes %d triangles\n", ref_node_n(ref_node),
         ref_cell_n(ref_grid_tri(ref_grid)));

  snprintf(filename, 896, "%s-tetgen.poly", project);
  RSS(ref_export_by_extension(ref_grid, filename), "poly");

  printf("  The 'S1000' argument can be added to tetgen options\n");
  printf("    to cap inserted nodes at 1000 and reduce run time.\n");
  printf("  The 'q20/10' arguments (radius-edge-ratio/dihedral-angle)\n");
  printf("    can be increased for faster initial volume refinement.\n");
  printf("  The 'O7/7' arguments (optimization iterations/operation)\n");
  printf("    can be decreased for faster mesh optimization.\n");
  printf("  See 'ref bootstrap -h' for '--mesher-options' description\n");
  printf("    and the TetGen user manual for details.\n");

  if (NULL == options) {
    snprintf(command, 1024,
             "tetgen -pMYq20/10O7/7zVT1e-12 %s < /dev/null > %s-tetgen.txt",
             filename, project);
  } else {
    snprintf(command, 1024, "tetgen %s %s < /dev/null > %s-tetgen.txt", options,
             filename, project);
  }
  printf("%s\n", command);
  fflush(stdout);
  REIS(0, sleep(2), "sleep failed");
  system_status = system(command);
  REIS(0, sleep(2), "sleep failed");
  REIB(0, system_status, "tetgen failed", {
    printf("tec360 ref_geom_test_tetgen_geom.tec\n");
    ref_geom_tec(ref_grid, "ref_geom_test_tetgen_geom.tec");
    printf("tec360 ref_geom_test_tetgen_surf.tec\n");
    ref_export_tec_surf(ref_grid, "ref_geom_test_tetgen_surf.tec");
  });

  snprintf(filename, 896, "%s-tetgen.1.node", project);
  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  REIS(1, fscanf(file, "%d", &nnode), "node header nnode");
  REIS(1, fscanf(file, "%d", &ndim), "node header ndim");
  REIS(3, ndim, "not 3D");
  REIS(1, fscanf(file, "%d", &attr), "node header attr");
  REIS(0, attr, "nodes have attribute 3D");
  REIS(1, fscanf(file, "%d", &mark), "node header mark");
  REIS(0, mark, "nodes have mark");

  /* verify surface nodes */
  nnode_surface = ref_node_n(ref_node);

  printf("%d interior nodes\n", nnode - nnode_surface);

  for (node = 0; node < nnode_surface; node++) {
    REIS(1, fscanf(file, "%d", &item), "node item");
    RES(node, item, "node index");
    RES(1, fscanf(file, "%lf", &(xyz[0])), "x");
    RES(1, fscanf(file, "%lf", &(xyz[1])), "y");
    RES(1, fscanf(file, "%lf", &(xyz[2])), "z");
    dist = sqrt((xyz[0] - ref_node_xyz(ref_node, 0, node)) *
                    (xyz[0] - ref_node_xyz(ref_node, 0, node)) +
                (xyz[1] - ref_node_xyz(ref_node, 1, node)) *
                    (xyz[1] - ref_node_xyz(ref_node, 1, node)) +
                (xyz[2] - ref_node_xyz(ref_node, 2, node)) *
                    (xyz[2] - ref_node_xyz(ref_node, 2, node)));
    if (dist > 1.0e-12) {
      printf("node %d off by %e\n", node, dist);
      THROW("tetgen moved node");
    }
  }

  /* interior nodes */
  for (node = nnode_surface; node < nnode; node++) {
    REIS(1, fscanf(file, "%d", &item), "node item");
    REIS(node, item, "file node index");
    RSS(ref_node_next_global(ref_node, &global), "next global");
    REIS(node, global, "global node index");
    RSS(ref_node_add(ref_node, global, &new_node), "new_node");
    RES(node, new_node, "node index");
    RES(1, fscanf(file, "%lf", &(xyz[0])), "x");
    RES(1, fscanf(file, "%lf", &(xyz[1])), "y");
    RES(1, fscanf(file, "%lf", &(xyz[2])), "z");
    ref_node_xyz(ref_node, 0, new_node) = xyz[0];
    ref_node_xyz(ref_node, 1, new_node) = xyz[1];
    ref_node_xyz(ref_node, 2, new_node) = xyz[2];
  }

  fclose(file);

  /* check .1.face when paranoid, but tetgen -z should not mess with them */
  problem = REF_FALSE;
  snprintf(filename, 896, "%s-tetgen.1.face", project);
  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");
  REIS(1, fscanf(file, "%d", &ntri), "face header ntri");
  REIS(1, fscanf(file, "%d", &mark), "face header mark");
  REIS(1, mark, "face have mark");

  ref_cell = ref_grid_tri(ref_grid);
  ref_malloc_init(position, ref_cell_max(ref_cell), REF_INT, REF_EMPTY);
  for (cell = 0; cell < ntri; cell++) {
    REIS(1, fscanf(file, "%d", &item), "tri item");
    RES(cell, item, "tri index");
    for (node = 0; node < 3; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "tri");
    if (1 == mark) REIS(1, fscanf(file, "%d", &id), "tri mark id");
    if (REF_SUCCESS == ref_cell_with(ref_cell, nodes, &new_cell)) {
      position[new_cell] = cell;
    } else {
      problem = REF_TRUE;
      ref_node_location(ref_node, nodes[0]);
      ref_node_location(ref_node, nodes[1]);
      ref_node_location(ref_node, nodes[2]);
      REF_WHERE("tetgen face tri not found in ref_grid");
    }
  }
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (REF_EMPTY == position[cell]) {
      problem = REF_TRUE;
      ref_node_location(ref_node, nodes[0]);
      ref_node_location(ref_node, nodes[1]);
      ref_node_location(ref_node, nodes[2]);
      printf("face id %d\n", nodes[3]);
      REF_WHERE("ref_grid tri not found in tetgen face");
    }
  }
  ref_free(position);
  RAS(!problem, "problem detected in tetgen triangles");

  fclose(file);

  snprintf(filename, 896, "%s-tetgen.1.ele", project);
  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  REIS(1, fscanf(file, "%d", &ntet), "ele header ntet");
  REIS(1, fscanf(file, "%d", &node_per), "ele header node_per");
  REIS(4, node_per, "expected tets");
  REIS(1, fscanf(file, "%d", &mark), "ele header mark");
  REIS(0, mark, "ele have mark");

  ref_cell = ref_grid_tet(ref_grid);
  for (cell = 0; cell < ntet; cell++) {
    REIS(1, fscanf(file, "%d", &item), "tet item");
    RES(cell, item, "tet index");
    for (node = 0; node < 4; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "tet");
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "new tet");
    RES(cell, new_cell, "tet index");
  }

  fclose(file);

  ref_grid_surf(ref_grid) = REF_FALSE;

  if (delete_temp_files) {
    snprintf(filename, 896, "%s-tetgen.1.edge", project);
    REIS(0, remove(filename), "rm .1.edge tetgen output file");
    snprintf(filename, 896, "%s-tetgen.1.face", project);
    REIS(0, remove(filename), "rm .1.face tetgen output file");
    snprintf(filename, 896, "%s-tetgen.1.node", project);
    REIS(0, remove(filename), "rm .1.node tetgen output file");
    snprintf(filename, 896, "%s-tetgen.1.ele", project);
    REIS(0, remove(filename), "rm .1.ele tetgen output file");
    snprintf(filename, 896, "%s-tetgen.poly", project);
    REIS(0, remove(filename), "rm .poly tetgen input file");
  }

  return REF_SUCCESS;
}